

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Inventory(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  uint uVar1;
  int iVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  char *pcVar5;
  undefined8 *puVar6;
  long *plVar7;
  bool bVar8;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042c79a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042c781:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042c79a:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x338,
                  "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  plVar7 = (long *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (plVar7 == (long *)0x0) goto LAB_0042c699;
    pPVar3 = (PClass *)plVar7[1];
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)(**(code **)*plVar7)(plVar7);
      plVar7[1] = (long)pPVar3;
    }
    bVar8 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar4 && bVar8) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar4) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042c79a;
    }
  }
  else {
    if (plVar7 != (long *)0x0) goto LAB_0042c781;
LAB_0042c699:
    plVar7 = (long *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042c7b9;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0042c78a:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042c7b9;
  }
  puVar6 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar6 == (undefined8 *)0x0) goto LAB_0042c6cc;
  }
  else {
    if (puVar6 != (undefined8 *)0x0) goto LAB_0042c78a;
LAB_0042c6cc:
    NullParam("\"item\"");
    puVar6 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar6 == (undefined8 *)0x0) {
      puVar6 = (undefined8 *)0x0;
      goto LAB_0042c73f;
    }
  }
  pPVar3 = AInventory::RegistrationInfo.MyClass;
  pPVar4 = (PClass *)puVar6[1];
  if (pPVar4 == (PClass *)0x0) {
    pPVar4 = (PClass *)(**(code **)*puVar6)(puVar6);
    puVar6[1] = pPVar4;
  }
  bVar8 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar3 && bVar8) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar8 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar3) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (!bVar8) {
    pcVar5 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
LAB_0042c7b9:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x339,
                  "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0042c73f:
  uVar1 = (**(code **)(*plVar7 + 0xb8))(plVar7,puVar6);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x33a,
                    "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = uVar1 & 0xff;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Inventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_BOOL(self->UseInventory(item));
}